

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O2

void feat_cmn(feat_t *fcb,mfcc_t **mfc,int32 nfr,int32 beginutt,int32 endutt)

{
  cmn_type_t cVar1;
  
  cVar1 = fcb->cmn;
  if (cVar1 == CMN_NONE || endutt != 0 && beginutt != 0) {
    if (cVar1 != CMN_LIVE) {
      if (cVar1 != CMN_BATCH) {
        return;
      }
      cmn(fcb->cmn_struct,mfc,fcb->varnorm,nfr);
      return;
    }
  }
  else {
    fcb->cmn = CMN_LIVE;
  }
  cmn_live(fcb->cmn_struct,mfc,fcb->varnorm,nfr);
  if (endutt == 0) {
    return;
  }
  cmn_live_update(fcb->cmn_struct);
  return;
}

Assistant:

static void
feat_cmn(feat_t *fcb, mfcc_t **mfc, int32 nfr, int32 beginutt, int32 endutt)
{
    cmn_type_t cmn_type = fcb->cmn;

    if (!(beginutt && endutt)
        && cmn_type != CMN_NONE) /* Only cmn_prior in block computation mode. */
        fcb->cmn = cmn_type = CMN_LIVE;

    switch (cmn_type) {
    case CMN_BATCH:
        cmn(fcb->cmn_struct, mfc, fcb->varnorm, nfr);
        break;
    case CMN_LIVE:
        cmn_live(fcb->cmn_struct, mfc, fcb->varnorm, nfr);
        if (endutt)
            cmn_live_update(fcb->cmn_struct);
        break;
    default:
        ;
    }
    cep_dump_dbg(fcb, mfc, nfr, "After CMN");
}